

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O2

void av1_read_tx_type(AV1_COMMON *cm,MACROBLOCKD *xd,int blk_row,int blk_col,TX_SIZE tx_size,
                     aom_reader *r)

{
  uint8_t *puVar1;
  MB_MODE_INFO *pMVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  PREDICTION_MODE *pPVar7;
  aom_cdf_prob (*cdf) [17];
  
  puVar1 = xd->tx_type_map;
  pMVar2 = *xd->mi;
  iVar6 = blk_row * xd->tx_type_map_stride + blk_col;
  puVar1[iVar6] = '\0';
  if (pMVar2->skip_txfm == '\0') {
    uVar5 = *(ushort *)&pMVar2->field_0xa7 & 7;
    if ((((cm->seg).enabled == '\0') || (((cm->seg).feature_mask[uVar5] & 0x40) == 0)) &&
       (xd->qindex[uVar5] != 0)) {
      if ((char)*(ushort *)&pMVar2->field_0xa7 < '\0') {
        uVar5 = 1;
      }
      else {
        uVar5 = (uint)('\0' < pMVar2->ref_frame[0]);
      }
      bVar3 = av1_get_ext_tx_set_type(tx_size,uVar5,(uint)(cm->features).reduced_tx_set_used);
      if (bVar3 != 0) {
        if (uVar5 == 0) {
          if ((pMVar2->filter_intra_mode_info).use_filter_intra == '\0') {
            pPVar7 = &pMVar2->mode;
          }
          else {
            pPVar7 = "" + (pMVar2->filter_intra_mode_info).filter_intra_mode;
          }
          cdf = xd->tile_ctx->intra_ext_tx_cdf[ext_tx_set_index[uVar5][bVar3]][""[tx_size]] +
                *pPVar7;
        }
        else {
          cdf = xd->tile_ctx->inter_ext_tx_cdf[ext_tx_set_index[uVar5][bVar3]] + ""[tx_size];
        }
        iVar4 = aom_read_symbol_(r,*cdf,av1_num_ext_tx_set[bVar3]);
        puVar1[iVar6] = (uint8_t)av1_ext_tx_inv[bVar3][iVar4];
      }
    }
  }
  return;
}

Assistant:

void av1_read_tx_type(const AV1_COMMON *const cm, MACROBLOCKD *xd, int blk_row,
                      int blk_col, TX_SIZE tx_size, aom_reader *r) {
  MB_MODE_INFO *mbmi = xd->mi[0];
  uint8_t *tx_type =
      &xd->tx_type_map[blk_row * xd->tx_type_map_stride + blk_col];
  *tx_type = DCT_DCT;

  // No need to read transform type if block is skipped.
  if (mbmi->skip_txfm ||
      segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_SKIP))
    return;

  // No need to read transform type for lossless mode(qindex==0).
  const int qindex = xd->qindex[mbmi->segment_id];
  if (qindex == 0) return;

  const int inter_block = is_inter_block(mbmi);
  if (get_ext_tx_types(tx_size, inter_block, cm->features.reduced_tx_set_used) >
      1) {
    const TxSetType tx_set_type = av1_get_ext_tx_set_type(
        tx_size, inter_block, cm->features.reduced_tx_set_used);
    const int eset =
        get_ext_tx_set(tx_size, inter_block, cm->features.reduced_tx_set_used);
    // eset == 0 should correspond to a set with only DCT_DCT and
    // there is no need to read the tx_type
    assert(eset != 0);

    const TX_SIZE square_tx_size = txsize_sqr_map[tx_size];
    FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
    if (inter_block) {
      *tx_type = av1_ext_tx_inv[tx_set_type][aom_read_symbol(
          r, ec_ctx->inter_ext_tx_cdf[eset][square_tx_size],
          av1_num_ext_tx_set[tx_set_type], ACCT_STR)];
    } else {
      const PREDICTION_MODE intra_mode =
          mbmi->filter_intra_mode_info.use_filter_intra
              ? fimode_to_intradir[mbmi->filter_intra_mode_info
                                       .filter_intra_mode]
              : mbmi->mode;
      *tx_type = av1_ext_tx_inv[tx_set_type][aom_read_symbol(
          r, ec_ctx->intra_ext_tx_cdf[eset][square_tx_size][intra_mode],
          av1_num_ext_tx_set[tx_set_type], ACCT_STR)];
    }
  }
}